

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

iterator * __thiscall
google::
dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
::find<HashObject<4,4>>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
          *this,HashObject<4,_4> *key)

{
  long lVar1;
  long lVar2;
  pointer ppVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  
  if (*(long *)(this + 0x30) != *(long *)(this + 0x28)) {
    pVar4 = find_position<HashObject<4,4>>(this,key);
    if (pVar4.first != 0xffffffffffffffff) {
      lVar1 = *(long *)(this + 0x38);
      lVar2 = *(long *)(this + 0x48);
      __return_storage_ptr__->ht =
           (dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)this;
      __return_storage_ptr__->pos = (pointer)(lVar2 + pVar4.first * 8);
      __return_storage_ptr__->end = (pointer)(lVar2 + lVar1 * 8);
      return __return_storage_ptr__;
    }
  }
  ppVar3 = (pointer)(*(long *)(this + 0x38) * 8 + *(long *)(this + 0x48));
  __return_storage_ptr__->ht =
       (dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)this;
  __return_storage_ptr__->pos = ppVar3;
  __return_storage_ptr__->end = ppVar3;
  dense_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::advance_past_empty_and_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

iterator find(const K& key) {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return iterator(this, table + pos.first, table + num_buckets, false);
  }